

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O1

int re_match(re_pattern_buffer *__buffer,char *__string,int __length,int __start,
            re_registers *__regs)

{
  byte bVar1;
  byte bVar2;
  void *pvVar3;
  bool bVar4;
  long lVar5;
  regoff_t *__buffer_00;
  re_registers *prVar6;
  int iVar7;
  int iVar8;
  ushort **ppuVar9;
  undefined4 in_register_0000000c;
  long lVar10;
  int __length_00;
  undefined4 in_register_00000014;
  byte *pbVar11;
  ulong __n;
  undefined1 *__src;
  uint uVar12;
  void *in_R9;
  int iVar13;
  byte *__s1;
  int unaff_R15D;
  bool bVar14;
  bool bVar15;
  re_machine sub_machine;
  re_group_register regs2 [10];
  re_group_register regs1 [10];
  ulong local_1c8;
  re_registers local_1a8;
  re_registers *local_190;
  int local_184;
  byte *local_180;
  undefined1 local_178 [160];
  undefined1 local_d8 [168];
  
  __s1 = (byte *)CONCAT44(in_register_00000014,__length);
  local_1c8 = CONCAT44(in_register_0000000c,__start);
  uVar12 = __regs->num_regs;
  if ((long)(int)uVar12 != -1) {
    lVar10 = (long)(int)uVar12 * 0x20;
    bVar1 = *(byte *)(__buffer->used + 0x18 + lVar10);
    if (((bVar1 & 6) != 0) && (lVar10 = (long)*(char *)(__buffer->used + lVar10), lVar10 < 10)) {
      lVar10 = lVar10 * 0x10;
      lVar5 = lVar10 + 8;
      if ((bVar1 & 2) != 0) {
        lVar5 = lVar10;
      }
      *(byte **)((long)in_R9 + lVar5) = __s1;
    }
  }
  iVar13 = 0;
  local_1a8.start = (regoff_t *)__s1;
  local_1a8.end = (regoff_t *)__buffer;
  local_190 = __regs;
  if (uVar12 != *(uint *)&__regs->field_0x4) {
    do {
      pbVar11 = (byte *)((long)(int)uVar12 * 0x20 + *(ulong *)((long)local_1a8.end + 0x10));
      if (((uVar12 != 0xffffffff) && ((pbVar11[0x18] & 6) != 0)) && ((long)(char)*pbVar11 < 10)) {
        pvVar3 = (void *)((long)in_R9 + 8);
        if ((pbVar11[0x18] & 2) != 0) {
          pvVar3 = in_R9;
        }
        *(byte **)((long)pvVar3 + (long)(char)*pbVar11 * 0x10) = __s1;
      }
      if ((pbVar11[0x18] & 6) != 0) {
switchD_0021f08a_caseD_1:
        if (*(int *)(pbVar11 + 8) != -1) {
          memcpy(local_d8,in_R9,0xa0);
          prVar6 = local_190;
          __buffer_00 = local_1a8.end;
          local_1a8.num_regs = *(uint *)(pbVar11 + 4);
          local_1a8._4_4_ = *(undefined4 *)&local_190->field_0x4;
          __length_00 = (int)__s1;
          local_180 = pbVar11;
          local_184 = re_match((re_pattern_buffer *)local_1a8.end,__string,__length_00,
                               (int)local_1c8,&local_1a8);
          memcpy(local_178,in_R9,0xa0);
          iVar8 = local_184;
          local_1a8.num_regs = *(uint *)(local_180 + 8);
          local_1a8._4_4_ = *(undefined4 *)&prVar6->field_0x4;
          iVar7 = re_match((re_pattern_buffer *)__buffer_00,__string,__length_00,(int)local_1c8,
                           &local_1a8);
          if ((-1 < iVar8) || (iVar13 = -1, -1 < iVar7)) {
            __src = local_d8;
            if (iVar8 <= iVar7) {
              __src = local_178;
              iVar8 = iVar7;
            }
            memcpy(in_R9,__src,0xa0);
            iVar13 = (__length_00 - (int)local_1a8.start) + iVar8;
          }
          bVar4 = false;
          goto LAB_0021f3d7;
        }
        goto LAB_0021f378;
      }
      bVar1 = *pbVar11;
      if (0x15 < bVar1 - 1) {
        iVar13 = -1;
        if ((local_1c8 != 0) && (bVar1 == *__s1)) {
          __s1 = __s1 + 1;
          local_1c8 = local_1c8 - 1;
          goto LAB_0021f378;
        }
        goto LAB_0021f3d0;
      }
      switch((uint)bVar1) {
      case 1:
        goto switchD_0021f08a_caseD_1;
      case 2:
        if (local_1c8 != 0) {
          __s1 = __s1 + 1;
          local_1c8 = local_1c8 - 1;
          goto LAB_0021f378;
        }
        iVar13 = -1;
        bVar4 = false;
        local_1c8 = 0;
        break;
      case 3:
        if (__s1 == (byte *)__string) goto LAB_0021f378;
LAB_0021f236:
        iVar13 = -1;
        goto LAB_0021f3d0;
      case 4:
        bVar4 = false;
        if (local_1c8 == 0) {
          local_1c8 = 0;
          goto LAB_0021f378;
        }
        iVar13 = -1;
        break;
      case 5:
        if (__s1 == (byte *)__string) {
          if (local_1c8 == 0) goto LAB_0021f236;
        }
        else {
          bVar1 = __s1[-1];
          ppuVar9 = __ctype_b_loc();
          bVar4 = false;
          iVar13 = -1;
          if ((*(byte *)((long)*ppuVar9 + (ulong)bVar1 * 2 + 1) & 0xc) != 0) goto LAB_0021f447;
          if (local_1c8 == 0) break;
        }
        bVar1 = *__s1;
        goto LAB_0021f42b;
      case 6:
        if (local_1c8 == 0) {
          if (__s1 == (byte *)__string) goto LAB_0021f236;
        }
        else {
          bVar1 = *__s1;
          ppuVar9 = __ctype_b_loc();
          bVar4 = false;
          iVar13 = -1;
          if (__s1 == (byte *)__string) goto LAB_0021f447;
          if (((*ppuVar9)[bVar1] & 0xc00) != 0) break;
        }
        bVar1 = __s1[-1];
LAB_0021f42b:
        ppuVar9 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar9 + (ulong)bVar1 * 2 + 1) & 0xc) == 0) {
LAB_0021f447:
          bVar4 = false;
          iVar13 = -1;
        }
        else {
LAB_0021f378:
          iVar13 = unaff_R15D;
          uVar12 = *(uint *)(pbVar11 + 4);
          bVar4 = true;
          if (uVar12 == *(uint *)&local_190->field_0x4) {
            if (uVar12 != 0xffffffff) {
              bVar1 = *(byte *)(*(ulong *)((long)local_1a8.end + 0x10) + 0x18 +
                               (long)(int)uVar12 * 0x20);
              if (((bVar1 & 6) != 0) &&
                 (lVar10 = (long)*(char *)(*(ulong *)((long)local_1a8.end + 0x10) +
                                          (long)(int)uVar12 * 0x20), lVar10 < 10)) {
                pvVar3 = (void *)((long)in_R9 + 8);
                if ((bVar1 & 2) != 0) {
                  pvVar3 = in_R9;
                }
                *(byte **)((long)pvVar3 + lVar10 * 0x10) = __s1;
              }
            }
            iVar13 = (int)__s1 - (int)local_1a8.start;
            goto LAB_0021f3d0;
          }
        }
        break;
      case 7:
        iVar13 = -1;
        if (local_1c8 != 0) {
          bVar1 = *__s1;
          ppuVar9 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar9 + (ulong)bVar1 * 2 + 1) & 0xc) == 0) goto LAB_0021f447;
LAB_0021f31b:
          __s1 = __s1 + 1;
          local_1c8 = local_1c8 - 1;
          goto LAB_0021f378;
        }
        goto LAB_0021f3d0;
      case 8:
        iVar13 = -1;
        if (local_1c8 == 0) goto LAB_0021f3d0;
        bVar1 = *__s1;
        ppuVar9 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar9 + (ulong)bVar1 * 2 + 1) & 0xc) == 0) goto LAB_0021f31b;
        goto LAB_0021f447;
      case 9:
      case 10:
        bVar15 = false;
        if (__s1 != (byte *)__string) {
          bVar2 = __s1[-1];
          ppuVar9 = __ctype_b_loc();
          bVar15 = (*(byte *)((long)*ppuVar9 + (ulong)bVar2 * 2 + 1) & 0xc) != 0;
        }
        bVar14 = false;
        if (local_1c8 != 0) {
          bVar2 = *__s1;
          ppuVar9 = __ctype_b_loc();
          bVar14 = (*(byte *)((long)*ppuVar9 + (ulong)bVar2 * 2 + 1) & 0xc) != 0;
        }
        bVar4 = false;
        iVar13 = -1;
        if ((bVar1 != 10 || bVar15 == bVar14) && (bVar15 != bVar14 || bVar1 != 9))
        goto LAB_0021f378;
        break;
      case 0xb:
      case 0xc:
        iVar13 = -1;
        if (local_1c8 == 0) {
          bVar15 = false;
          local_1c8 = 0;
        }
        else {
          bVar14 = (1 << (*__s1 & 7) &
                   (uint)*(byte *)(*(long *)(pbVar11 + 0x10) + (ulong)(*__s1 >> 3))) != 0;
          bVar15 = false;
          if ((bVar1 != 0xb || bVar14) && (bVar1 != 0xc || !bVar14)) {
            __s1 = __s1 + 1;
            local_1c8 = local_1c8 - 1;
            bVar15 = true;
            iVar13 = unaff_R15D;
          }
        }
        unaff_R15D = iVar13;
        if (bVar15) goto LAB_0021f378;
        goto LAB_0021f3d0;
      default:
        pvVar3 = *(void **)((long)in_R9 + (long)(char)bVar1 * 0x10 + -0xd0);
        iVar13 = -1;
        if ((pvVar3 == (void *)0x0) ||
           (lVar10 = *(long *)((long)in_R9 + (long)(char)bVar1 * 0x10 + -200), lVar10 == 0)) {
          bVar15 = false;
        }
        else {
          __n = lVar10 - (long)pvVar3;
          if (local_1c8 < __n) {
            bVar15 = false;
          }
          else {
            iVar8 = bcmp(__s1,pvVar3,__n);
            bVar15 = iVar8 == 0;
            if (bVar15) {
              __s1 = __s1 + __n;
              iVar13 = unaff_R15D;
              local_1c8 = local_1c8 - __n;
            }
          }
        }
        unaff_R15D = iVar13;
        if (bVar15) goto LAB_0021f378;
LAB_0021f3d0:
        bVar4 = false;
      }
LAB_0021f3d7:
      unaff_R15D = iVar13;
    } while (bVar4);
  }
  return iVar13;
}

Assistant:

static int re_match(re_context *ctx, const char *entire_str,
                    const char *str, size_t origlen,
                    const re_machine *machine, re_group_register *regs)
{
    re_state_id cur_state;
    const char *p;
    size_t curlen;

    /* start at the machine's initial state */
    cur_state = machine->init;

    /* start at the beginning of the string */
    p = str;
    curlen = origlen;

    /* note any group involved in the initial state */
    re_note_group(ctx, regs, cur_state, p);

    /* 
     *   if we're starting in the final state, immediately return success
     *   with a zero-length match 
     */
    if (cur_state == machine->final)
    {
        /* return success with a zero-length match */
        return 0;
    }

    /* run the machine */
    for (;;)
    {
        re_tuple *tuple;

        /* get the tuple for this state */
        tuple = &ctx->tuple_arr[cur_state];

        /* if this is a group state, adjust the group registers */
        re_note_group(ctx, regs, cur_state, p);
        
        /* see what kind of state we're in */
        if (!(tuple->flags & (RE_STATE_GROUP_BEGIN | RE_STATE_GROUP_END))
            && tuple->ch != RE_EPSILON)
        {
            /*
             *   This is a character or group recognizer state.  If we
             *   match the character or group, continue on to the next
             *   state; otherwise, return failure.
             */
            switch(tuple->ch)
            {
            case RE_GROUP_MATCH_0:
            case RE_GROUP_MATCH_0 + 1:
            case RE_GROUP_MATCH_0 + 2:
            case RE_GROUP_MATCH_0 + 3:
            case RE_GROUP_MATCH_0 + 4:
            case RE_GROUP_MATCH_0 + 5:
            case RE_GROUP_MATCH_0 + 6:
            case RE_GROUP_MATCH_0 + 7:
            case RE_GROUP_MATCH_0 + 8:
            case RE_GROUP_MATCH_0 + 9:
                {
                    int group_num;
                    re_group_register *group_reg;
                    size_t reg_len;
                    
                    /* it's a group - get the group number */
                    group_num = tuple->ch - RE_GROUP_MATCH_0;
                    group_reg = &regs[group_num];
                    
                    /* 
                     *   if this register isn't defined, there's nothing
                     *   to match, so fail 
                     */
                    if (group_reg->start_ofs == 0 || group_reg->end_ofs == 0)
                        return -1;
                    
                    /* calculate the length of the register value */
                    reg_len = group_reg->end_ofs - group_reg->start_ofs;
                    
                    /* if we don't have enough left to match, it fails */
                    if (curlen < reg_len)
                        return -1;
                    
                    /* if the string doesn't match exactly, we fail */
                    if (memcmp(p, group_reg->start_ofs, reg_len) != 0)
                        return -1;
                    
                    /*
                     *   It matches exactly - skip the entire length of
                     *   the register in the source string 
                     */
                    p += reg_len;
                    curlen -= reg_len;
                }
                break;

            case RE_TEXT_BEGIN:
                /* 
                 *   Match only the exact beginning of the string - if
                 *   we're anywhere else, this isn't a match.  If this
                 *   succeeds, we don't skip any characters.  
                 */
                if (p != entire_str)
                    return -1;
                break;

            case RE_TEXT_END:
                /*
                 *   Match only the exact end of the string - if we're
                 *   anywhere else, this isn't a match.  Don't skip any
                 *   characters on success.  
                 */
                if (curlen != 0)
                    return -1;
                break;

            case RE_WORD_BEGIN:
                /* 
                 *   if the previous character is a word character, we're
                 *   not at the beginning of a word 
                 */
                if (p != entire_str && re_is_word_char(*(p-1)))
                    return -1;

                /* 
                 *   if we're at the end of the string, or the current
                 *   character isn't the start of a word, we're not at the
                 *   beginning of a word 
                 */
                if (curlen == 0 || !re_is_word_char(*p))
                    return -1;
                break;

            case RE_WORD_END:
                /*
                 *   if the current character is a word character, we're not
                 *   at the end of a word 
                 */
                if (curlen != 0 && re_is_word_char(*p))
                    return -1;

                /*
                 *   if we're at the beginning of the string, or the
                 *   previous character is not a word character, we're not
                 *   at the end of a word 
                 */
                if (p == entire_str || !re_is_word_char(*(p-1)))
                    return -1;
                break;

            case RE_WORD_CHAR:
                /* if it's not a word character, it's a failure */
                if (curlen == 0 || !re_is_word_char(*p))
                    return -1;

                /* skip this character of input */
                ++p;
                --curlen;
                break;

            case RE_NON_WORD_CHAR:
                /* if it's a word character, it's a failure */
                if (curlen == 0 || re_is_word_char(*p))
                    return -1;

                /* skip the input */
                ++p;
                --curlen;
                break;

            case RE_WORD_BOUNDARY:
            case RE_NON_WORD_BOUNDARY:
                {
                    int prev_is_word;
                    int next_is_word;
                    int boundary;

                    /*
                     *   Determine if the previous character is a word
                     *   character -- if we're at the beginning of the
                     *   string, it's obviously not, otherwise check its
                     *   classification 
                     */
                    prev_is_word = (p != entire_str
                                    && re_is_word_char(*(p-1)));

                    /* make the same check for the current character */
                    next_is_word = (curlen != 0
                                    && re_is_word_char(*p));

                    /*
                     *   Determine if this is a boundary - it is if the
                     *   two states are different 
                     */
                    boundary = ((prev_is_word != 0) ^ (next_is_word != 0));

                    /* 
                     *   make sure it matches what was desired, and return
                     *   failure if not 
                     */
                    if ((tuple->ch == RE_WORD_BOUNDARY && !boundary)
                        || (tuple->ch == RE_NON_WORD_BOUNDARY && boundary))
                        return -1;
                }
                break;

            case RE_WILDCARD:
                /* make sure we have a character to match */
                if (curlen == 0)
                    return -1;

                /* skip this character */
                ++p;
                --curlen;
                break;

            case RE_RANGE:
            case RE_RANGE_EXCL:
                {
                    int match;
                    
                    /* make sure we have a character to match */
                    if (curlen == 0)
                        return -1;
                    
                    /* see if we match */
                    match = re_is_bit_set(tuple->char_range,
                                          (int)(unsigned char)*p);
                    
                    /* make sure we got what we wanted */
                    if ((tuple->ch == RE_RANGE && !match)
                        || (tuple->ch == RE_RANGE_EXCL && match))
                        return -1;

                    /* skip this character of the input */
                    ++p;
                    --curlen;
                }
                break;

            default:
                /* make sure we have an exact match */
                if (curlen == 0 || tuple->ch != *p)
                    return -1;

                /* skip this character of the input */
                ++p;
                --curlen;
                break;
            }

            /* 
             *   if we got this far, we were successful - move on to the
             *   next state 
             */
            cur_state = tuple->next_state_1;
        }
        else if (tuple->next_state_2 == RE_STATE_INVALID)
        {
            /*
             *   We have only one transition, so this state is entirely
             *   deterministic.  Simply move on to the next state. 
             */
            cur_state = tuple->next_state_1;
        }
        else
        {
            re_machine sub_machine;
            re_group_register regs1[RE_GROUP_REG_CNT];
            re_group_register regs2[RE_GROUP_REG_CNT];
            int ret1;
            int ret2;
            
            /*
             *   This state has two possible transitions, and we don't
             *   know which one to take.  So, try both, see which one
             *   works better, and return the result.  Try the first
             *   transition first.  Note that each separate attempt must
             *   use a separate copy of the registers.  
             */
            memcpy(regs1, regs, sizeof(regs1));
            sub_machine.init = tuple->next_state_1;
            sub_machine.final = machine->final;
            ret1 = re_match(ctx, entire_str, p, curlen, &sub_machine, regs1);

            /*
             *   Now try the second transition 
             */
            memcpy(regs2, regs, sizeof(regs2));
            sub_machine.init = tuple->next_state_2;
            sub_machine.final = machine->final;
            ret2 = re_match(ctx, entire_str, p, curlen, &sub_machine, regs2);

            /*
             *   If they both failed, the whole thing failed.  Otherwise,
             *   return the longer of the two, plus the length we
             *   ourselves matched previously.  Note that we return the
             *   register set from the winning match.  
             */
            if (ret1 < 0 && ret2 < 0)
            {
                /* they both failed */
                return -1;
            }
            else if (ret1 > ret2)
            {
                /* use the first register set and result length */
                memcpy(regs, regs1, sizeof(regs1));
                return ret1 + (p - str);
            }
            else
            {
                /* use the second register set and result length */
                memcpy(regs, regs2, sizeof(regs2));
                return ret2 + (p - str);
            }
        }

        /*
         *   If we're in the final state, return success 
         */
        if (cur_state == machine->final)
        {
            /* finish off any group involved in the final state */
            re_note_group(ctx, regs, cur_state, p);
            
            /* return the length we matched */
            return p - str;
        }
    }
}